

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

void __thiscall Moc::generate(Moc *this,FILE *out,FILE *jsonOutput)

{
  QLatin1StringView s;
  QLatin1StringView key;
  QLatin1StringView key_00;
  QLatin1StringView key_01;
  bool bVar1;
  char cVar2;
  int iVar3;
  const_pointer pvVar4;
  qsizetype qVar5;
  const_iterator o;
  const_iterator o_00;
  char *pcVar6;
  FILE *in_RDX;
  Moc *in_RSI;
  FILE *in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<char,_QByteArray_&> QVar7;
  ClassDef *cdef;
  add_const_t<QList<ClassDef>_> *__range2_1;
  ClassDef *def;
  QList<ClassDef> *__range1_1;
  QByteArray *qtContainer;
  QByteArrayList *__range1;
  add_const_t<QList<QByteArray>_> *__range2;
  QJsonDocument jsonDoc;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  QJsonArray classesJsonFormatted;
  QJsonObject mocData;
  iterator __end1_1;
  iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArrayList qtContainers;
  QByteArray inc;
  const_iterator __end2;
  const_iterator __begin2;
  QByteArrayView fn;
  Generator generator;
  Moc *in_stack_fffffffffffffcc8;
  uint in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  Moc *in_stack_fffffffffffffcd8;
  JsonFormat format;
  QByteArray *in_stack_fffffffffffffce0;
  Moc *__stream;
  Moc *in_stack_fffffffffffffce8;
  undefined7 in_stack_fffffffffffffcf0;
  undefined1 uVar8;
  Moc *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  Moc *__stream_00;
  char *in_stack_fffffffffffffd28;
  Parser *in_stack_fffffffffffffd30;
  const_iterator local_220;
  undefined1 *local_218;
  QJsonValueConstRef local_210;
  QJsonValueConstRef local_1f0;
  undefined1 *local_1e0;
  ClassDef *local_1d8;
  iterator local_1d0;
  iterator local_1c8;
  QByteArray *local_1c0;
  const_iterator local_1b8;
  const_iterator local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  undefined1 local_182;
  undefined1 local_181;
  char local_180;
  QByteArray *local_178;
  ClassDef *in_stack_fffffffffffffe98;
  const_iterator local_128;
  QByteArrayView local_120;
  Generator *in_stack_ffffffffffffff28;
  undefined1 local_b0 [168];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_120.m_data = &DAT_aaaaaaaaaaaaaaaa;
  local_120.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_120 = strippedFileName(in_stack_fffffffffffffcd8);
  __stream_00 = in_RSI;
  pvVar4 = QByteArrayView::constData((QByteArrayView *)0x1550de);
  fprintf((FILE *)__stream_00,
          "/****************************************************************************\n** Meta object code from reading C++ file \'%s\'\n**\n"
          ,pvVar4);
  fprintf((FILE *)in_RSI,"** Created by: The Qt Meta Object Compiler version %d (Qt %s)\n**\n",0x45,
          "6.10.0");
  fprintf((FILE *)in_RSI,
          "** WARNING! All changes made in this file will be lost!\n*****************************************************************************/\n\n"
         );
  if (((byte)in_RDI[0x70] & 1) == 0) {
    qVar5 = QByteArray::size((QByteArray *)(in_RDI + 0x78));
    if ((qVar5 != 0) &&
       (bVar1 = QByteArray::endsWith
                          ((QByteArray *)
                           CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                           (char)((ulong)in_stack_fffffffffffffcc8 >> 0x38)), !bVar1)) {
      QByteArray::operator+=
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (char)((ulong)in_stack_fffffffffffffcc8 >> 0x38));
    }
    local_128.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
    local_128 = QList<QByteArray>::begin
                          ((QList<QByteArray> *)
                           CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    o = QList<QByteArray>::end
                  ((QList<QByteArray> *)
                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    while (bVar1 = QList<QByteArray>::const_iterator::operator!=(&local_128,o), bVar1) {
      QList<QByteArray>::const_iterator::operator*(&local_128);
      QByteArray::QByteArray
                ((QByteArray *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                 (QByteArray *)in_stack_fffffffffffffcc8);
      bVar1 = QByteArray::isEmpty((QByteArray *)0x15526b);
      if (((!bVar1) &&
          (cVar2 = QByteArray::at((QByteArray *)in_stack_fffffffffffffcc8,0x155284), cVar2 != '<'))
         && (cVar2 = QByteArray::at((QByteArray *)in_stack_fffffffffffffcc8,0x1552a1), cVar2 != '\"'
            )) {
        qVar5 = QByteArray::size((QByteArray *)(in_RDI + 0x78));
        in_stack_fffffffffffffd07 = false;
        if (qVar5 != 0) {
          in_stack_fffffffffffffd07 =
               ::operator!=((QByteArray *)in_stack_fffffffffffffce8,
                            (char **)in_stack_fffffffffffffce0);
        }
        if ((bool)in_stack_fffffffffffffd07 != false) {
          QByteArray::prepend(in_stack_fffffffffffffce0,(QByteArray *)in_stack_fffffffffffffcd8);
        }
        local_181 = 0x22;
        QVar7 = ::operator+((char *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                            (QByteArray *)in_stack_fffffffffffffcc8);
        local_178 = QVar7.b;
        local_180 = QVar7.a;
        local_182 = 0x22;
        ::operator+((QStringBuilder<char,_QByteArray_&> *)
                    CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                    (char *)in_stack_fffffffffffffcc8);
        ::QStringBuilder::operator_cast_to_QByteArray
                  ((QStringBuilder<QStringBuilder<char,_QByteArray_&>,_char> *)
                   in_stack_fffffffffffffcc8);
        QByteArray::operator=
                  ((QByteArray *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (QByteArray *)in_stack_fffffffffffffcc8);
        QByteArray::~QByteArray((QByteArray *)0x15539b);
      }
      in_stack_fffffffffffffcf8 = in_RSI;
      pcVar6 = QByteArray::constData((QByteArray *)0x1553b5);
      fprintf((FILE *)in_stack_fffffffffffffcf8,"#include %s\n",pcVar6);
      QByteArray::~QByteArray((QByteArray *)0x1553d8);
      QList<QByteArray>::const_iterator::operator++(&local_128);
    }
  }
  qVar5 = QList<ClassDef>::size((QList<ClassDef> *)(in_RDI + 0xa8));
  uVar8 = false;
  if (qVar5 != 0) {
    QList<ClassDef>::constFirst
              ((QList<ClassDef> *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    local_190 = "Qt";
    uVar8 = ::operator==(in_stack_fffffffffffffce0,(char **)in_stack_fffffffffffffcd8);
  }
  if ((bool)uVar8 != false) {
    fprintf((FILE *)in_RSI,"#include <QtCore/qobject.h>\n");
  }
  fprintf((FILE *)in_RSI,"#include <QtCore/qmetatype.h>\n");
  if (((byte)in_RDI[0x71] & 1) != 0) {
    fprintf((FILE *)in_RSI,"#include <QtCore/qplugin.h>\n");
  }
  local_1a8 = &DAT_aaaaaaaaaaaaaaaa;
  local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_198 = &DAT_aaaaaaaaaaaaaaaa;
  requiredQtContainers((QList<ClassDef> *)in_RDI);
  local_1b0.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_1b0 = QList<QByteArray>::begin
                        ((QList<QByteArray> *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  local_1b8.i = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_1b8 = QList<QByteArray>::end
                        ((QList<QByteArray> *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  while( true ) {
    local_1c0 = local_1b8.i;
    bVar1 = QList<QByteArray>::const_iterator::operator!=(&local_1b0,local_1b8);
    if (!bVar1) break;
    QList<QByteArray>::const_iterator::operator*(&local_1b0);
    in_stack_fffffffffffffce8 = in_RSI;
    pcVar6 = QByteArray::constData((QByteArray *)0x1555b3);
    fprintf((FILE *)in_stack_fffffffffffffce8,"#include <QtCore/%s>\n",pcVar6);
    QList<QByteArray>::const_iterator::operator++(&local_1b0);
  }
  fprintf((FILE *)in_RSI,"\n#include <QtCore/qtmochelpers.h>\n");
  fprintf((FILE *)in_RSI,"\n#include <memory>\n\n");
  fprintf((FILE *)in_RSI,"\n#include <QtCore/qxptype_traits.h>\n");
  __stream = in_RSI;
  pvVar4 = QByteArrayView::constData((QByteArrayView *)0x155637);
  fprintf((FILE *)__stream,
          "#if !defined(Q_MOC_OUTPUT_REVISION)\n#error \"The header file \'%s\' doesn\'t include <QObject>.\"\n"
          ,pvVar4);
  fprintf((FILE *)in_RSI,"#elif Q_MOC_OUTPUT_REVISION != %d\n",0x45);
  fprintf((FILE *)in_RSI,
          "#error \"This file was generated using the moc from %s. It\"\n#error \"cannot be used with the include files from this version of Qt.\"\n#error \"(The moc has changed too much.)\"\n"
          ,"6.10.0");
  fprintf((FILE *)in_RSI,"#endif\n\n");
  fprintf((FILE *)in_RSI,"#ifndef Q_CONSTINIT\n#define Q_CONSTINIT\n#endif\n\n");
  fprintf((FILE *)in_RSI,"QT_WARNING_PUSH\n");
  fprintf((FILE *)in_RSI,"QT_WARNING_DISABLE_DEPRECATED\n");
  fprintf((FILE *)in_RSI,"QT_WARNING_DISABLE_GCC(\"-Wuseless-cast\")\n");
  fputs("",(FILE *)in_RSI);
  local_1c8.i = (ClassDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_1c8 = QList<ClassDef>::begin
                        ((QList<ClassDef> *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  local_1d0.i = (ClassDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_1d0 = QList<ClassDef>::end
                        ((QList<ClassDef> *)
                         CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
  do {
    local_1d8 = local_1d0.i;
    bVar1 = QList<ClassDef>::iterator::operator!=(&local_1c8,local_1d0);
    if (!bVar1) {
      fputs("",(FILE *)in_RSI);
      fprintf((FILE *)in_RSI,"QT_WARNING_POP\n");
      if (in_RDX != (FILE *)0x0) {
        local_1e0 = &DAT_aaaaaaaaaaaaaaaa;
        QJsonObject::QJsonObject((QJsonObject *)0x15590d);
        QJsonValue::QJsonValue
                  ((QJsonValue *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20));
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffcd8,
                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        key.m_data._7_1_ = in_stack_fffffffffffffd07;
        key.m_data._0_7_ = in_stack_fffffffffffffd00;
        key.m_size = (qsizetype)__stream_00;
        local_1f0 = (QJsonValueConstRef)
                    QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffffcd8,key);
        QJsonValueRef::operator=((QJsonValueRef *)__stream,(QJsonValue *)in_stack_fffffffffffffcd8);
        QJsonValue::~QJsonValue((QJsonValue *)0x15598f);
        QByteArrayView::constData((QByteArrayView *)0x15599c);
        QLatin1StringView::QLatin1StringView
                  ((QLatin1StringView *)__stream,(char *)in_stack_fffffffffffffcd8);
        s.m_size = (qsizetype)in_stack_fffffffffffffce8;
        s.m_data = (char *)__stream;
        QJsonValue::QJsonValue((QJsonValue *)in_stack_fffffffffffffcc8,s);
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)in_stack_fffffffffffffcd8,
                   CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        key_00.m_data._7_1_ = in_stack_fffffffffffffd07;
        key_00.m_data._0_7_ = in_stack_fffffffffffffd00;
        key_00.m_size = (qsizetype)__stream_00;
        local_210 = (QJsonValueConstRef)
                    QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffffcd8,key_00);
        QJsonValueRef::operator=((QJsonValueRef *)__stream,(QJsonValue *)in_stack_fffffffffffffcd8);
        QJsonValue::~QJsonValue((QJsonValue *)0x155a2d);
        local_218 = &DAT_aaaaaaaaaaaaaaaa;
        QJsonArray::QJsonArray((QJsonArray *)0x155a49);
        local_220.i = (ClassDef *)&DAT_aaaaaaaaaaaaaaaa;
        local_220 = QList<ClassDef>::begin
                              ((QList<ClassDef> *)
                               CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        o_00 = QList<ClassDef>::end
                         ((QList<ClassDef> *)
                          CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        while (bVar1 = QList<ClassDef>::const_iterator::operator!=(&local_220,o_00), bVar1) {
          QList<ClassDef>::const_iterator::operator*(&local_220);
          ClassDef::toJson(in_stack_fffffffffffffe98);
          QJsonValue::QJsonValue((QJsonValue *)__stream,(QJsonObject *)in_stack_fffffffffffffcd8);
          QJsonArray::append((QJsonArray *)__stream,(QJsonValue *)in_stack_fffffffffffffcd8);
          QJsonValue::~QJsonValue((QJsonValue *)0x155b42);
          QJsonObject::~QJsonObject((QJsonObject *)0x155b4f);
          QList<ClassDef>::const_iterator::operator++(&local_220);
        }
        bVar1 = QJsonArray::isEmpty((QJsonArray *)__stream);
        if (!bVar1) {
          QJsonValue::QJsonValue((QJsonValue *)__stream,(QJsonArray *)in_stack_fffffffffffffcd8);
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffcd8,
                     CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
          key_01.m_data._7_1_ = in_stack_fffffffffffffd07;
          key_01.m_data._0_7_ = in_stack_fffffffffffffd00;
          key_01.m_size = (qsizetype)__stream_00;
          QJsonObject::operator[]((QJsonObject *)in_stack_fffffffffffffcd8,key_01);
          QJsonValueRef::operator=
                    ((QJsonValueRef *)__stream,(QJsonValue *)in_stack_fffffffffffffcd8);
          QJsonValue::~QJsonValue((QJsonValue *)0x155beb);
        }
        format = (JsonFormat)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
        QJsonDocument::QJsonDocument
                  ((QJsonDocument *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
                   (QJsonObject *)in_stack_fffffffffffffcc8);
        QJsonDocument::toJson((QJsonDocument *)__stream,format);
        pcVar6 = QByteArray::constData((QByteArray *)0x155c33);
        fputs(pcVar6,in_RDX);
        QByteArray::~QByteArray((QByteArray *)0x155c50);
        QJsonDocument::~QJsonDocument((QJsonDocument *)0x155c5d);
        QJsonArray::~QJsonArray((QJsonArray *)0x155c6a);
        QJsonObject::~QJsonObject((QJsonObject *)0x155c77);
      }
      QList<QByteArray>::~QList((QList<QByteArray> *)0x155c84);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return;
      }
LAB_00155ca2:
      __stack_chk_fail();
    }
    QList<ClassDef>::iterator::operator*(&local_1c8);
    memset(local_b0,0xaa,0x90);
    in_stack_fffffffffffffcd0 = (uint)((byte)in_RDI[0x72] & 1);
    in_stack_fffffffffffffcc8 = in_RSI;
    Generator::Generator
              ((Generator *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcf8,(ClassDef *)CONCAT17(uVar8,in_stack_fffffffffffffcf0),
               (QList<QByteArray> *)in_stack_fffffffffffffce8,
               (QHash<QByteArray,_QByteArray> *)__stream,
               (QHash<QByteArray,_QByteArray> *)in_stack_fffffffffffffcd8,in_RDI,
               SUB41((uint)in_stack_fffffffffffffcd4 >> 0x18,0));
    Generator::generateCode(in_stack_ffffffffffffff28);
    in_stack_fffffffffffffcd8 = (Moc *)Generator::registeredStringsCount((Generator *)0x15584a);
    iVar3 = std::numeric_limits<int>::max();
    if ((long)iVar3 <= (long)in_stack_fffffffffffffcd8) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        Parser::error(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
      }
      goto LAB_00155ca2;
    }
    Generator::~Generator
              ((Generator *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
    QList<ClassDef>::iterator::operator++(&local_1c8);
  } while( true );
}

Assistant:

void Moc::generate(FILE *out, FILE *jsonOutput)
{
    QByteArrayView fn = strippedFileName();

    fprintf(out, "/****************************************************************************\n"
            "** Meta object code from reading C++ file '%s'\n**\n" , fn.constData());
    fprintf(out, "** Created by: The Qt Meta Object Compiler version %d (Qt %s)\n**\n" , mocOutputRevision, QT_VERSION_STR);
    fprintf(out, "** WARNING! All changes made in this file will be lost!\n"
            "*****************************************************************************/\n\n");

    // include header(s) of user class definitions at _first_ to allow
    // for preprocessor definitions possibly affecting standard headers.
    // see https://codereview.qt-project.org/c/qt/qtbase/+/445937
    if (!noInclude) {
        if (includePath.size() && !includePath.endsWith('/'))
            includePath += '/';
        for (QByteArray inc : std::as_const(includeFiles)) {
            if (!inc.isEmpty() && inc.at(0) != '<' && inc.at(0) != '"') {
                if (includePath.size() && includePath != "./")
                    inc.prepend(includePath);
                inc = '\"' + inc + '\"';
            }
            fprintf(out, "#include %s\n", inc.constData());
        }
    }
    if (classList.size() && classList.constFirst().classname == "Qt")
        fprintf(out, "#include <QtCore/qobject.h>\n");

    fprintf(out, "#include <QtCore/qmetatype.h>\n");  // For QMetaType::Type
    if (mustIncludeQPluginH)
        fprintf(out, "#include <QtCore/qplugin.h>\n");

    const auto qtContainers = requiredQtContainers(classList);
    for (const QByteArray &qtContainer : qtContainers)
        fprintf(out, "#include <QtCore/%s>\n", qtContainer.constData());

    fprintf(out, "\n#include <QtCore/qtmochelpers.h>\n");

    fprintf(out, "\n#include <memory>\n\n");  // For std::addressof
    fprintf(out, "\n#include <QtCore/qxptype_traits.h>\n"); // is_detected

    fprintf(out, "#if !defined(Q_MOC_OUTPUT_REVISION)\n"
            "#error \"The header file '%s' doesn't include <QObject>.\"\n", fn.constData());
    fprintf(out, "#elif Q_MOC_OUTPUT_REVISION != %d\n", mocOutputRevision);
    fprintf(out, "#error \"This file was generated using the moc from %s."
            " It\"\n#error \"cannot be used with the include files from"
            " this version of Qt.\"\n#error \"(The moc has changed too"
            " much.)\"\n", QT_VERSION_STR);
    fprintf(out, "#endif\n\n");

#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0)
    fprintf(out, "#ifndef Q_CONSTINIT\n"
            "#define Q_CONSTINIT\n"
            "#endif\n\n");
#endif

    fprintf(out, "QT_WARNING_PUSH\n");
    fprintf(out, "QT_WARNING_DISABLE_DEPRECATED\n");
    fprintf(out, "QT_WARNING_DISABLE_GCC(\"-Wuseless-cast\")\n");

    fputs("", out);
    for (ClassDef &def : classList) {
        Generator generator(this, &def, metaTypes, knownQObjectClasses, knownGadgets, out,
                            requireCompleteTypes);
        generator.generateCode();

        // generator.generateCode() should have already registered all strings
        if (Q_UNLIKELY(generator.registeredStringsCount() >= std::numeric_limits<int>::max())) {
            error("internal limit exceeded: number of parsed strings is too big.");
            exit(EXIT_FAILURE);
        }
    }
    fputs("", out);

    fprintf(out, "QT_WARNING_POP\n");

    if (jsonOutput) {
        QJsonObject mocData;
        mocData["outputRevision"_L1] = mocOutputRevision;
        mocData["inputFile"_L1] = QLatin1StringView(fn.constData());

        QJsonArray classesJsonFormatted;

        for (const ClassDef &cdef: std::as_const(classList))
            classesJsonFormatted.append(cdef.toJson());

        if (!classesJsonFormatted.isEmpty())
            mocData["classes"_L1] = classesJsonFormatted;

        QJsonDocument jsonDoc(mocData);
        fputs(jsonDoc.toJson().constData(), jsonOutput);
    }
}